

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezePdu.cpp
# Opt level: O1

void __thiscall DIS::StopFreezePdu::marshal(StopFreezePdu *this,DataStream *dataStream)

{
  SimulationManagementFamilyPdu::marshal(&this->super_SimulationManagementFamilyPdu,dataStream);
  ClockTime::marshal(&this->_realWorldTime,dataStream);
  DataStream::operator<<(dataStream,this->_reason);
  DataStream::operator<<(dataStream,this->_frozenBehavior);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_requestID);
  return;
}

Assistant:

void StopFreezePdu::marshal(DataStream& dataStream) const
{
    SimulationManagementFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _realWorldTime.marshal(dataStream);
    dataStream << _reason;
    dataStream << _frozenBehavior;
    dataStream << _padding1;
    dataStream << _requestID;
}